

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void __thiscall
Js::JavascriptExceptionOperators::AutoCatchHandlerExists::FetchNonUserCodeStatus
          (AutoCatchHandlerExists *this,ScriptContext *scriptContext)

{
  ThreadContext *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  FunctionBody *this_01;
  FunctionBody *funcBody;
  JavascriptFunction *caller;
  ScriptContext *pSStack_18;
  bool fFound;
  ScriptContext *scriptContext_local;
  AutoCatchHandlerExists *this_local;
  
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x12,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  caller._7_1_ = 0;
  if ((this->m_previousCatchHandlerToUserCodeStatus & 1U) == 0) {
    funcBody = (FunctionBody *)0x0;
    BVar3 = JavascriptStackWalker::GetCaller((JavascriptFunction **)&funcBody,pSStack_18);
    if (((BVar3 != 0) && (funcBody != (FunctionBody *)0x0)) &&
       (this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)funcBody),
       this_01 != (FunctionBody *)0x0)) {
      this_00 = this->m_threadContext;
      bVar2 = ParseableFunctionInfo::IsNonUserCode(&this_01->super_ParseableFunctionInfo);
      ThreadContext::SetIsUserCode(this_00,!bVar2);
      caller._7_1_ = 1;
    }
  }
  if ((caller._7_1_ & 1) == 0) {
    ThreadContext::SetIsUserCode(this->m_threadContext,true);
  }
  return;
}

Assistant:

void JavascriptExceptionOperators::AutoCatchHandlerExists::FetchNonUserCodeStatus(ScriptContext * scriptContext)
    {
        Assert(scriptContext);

        bool fFound = false;
        // If the outer try catch was already in the user code, no need to go any further.
        if (!m_previousCatchHandlerToUserCodeStatus)
        {
            Js::JavascriptFunction* caller = nullptr;
            if (JavascriptStackWalker::GetCaller(&caller, scriptContext))
            {
                Js::FunctionBody *funcBody = NULL;
                if (caller != NULL && (funcBody = caller->GetFunctionBody()) != NULL)
                {
                    m_threadContext->SetIsUserCode(funcBody->IsNonUserCode() == false);
                    fFound = true;
                }
            }
        }

        if (!fFound)
        {
            // If not successfully able to find the caller, set this catch handler belongs to the user code.
            m_threadContext->SetIsUserCode(true);
        }
    }